

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O2

Tree flutes_c(int d,int *xs,int *ys,int *s,int acc)

{
  int *piVar1;
  int *piVar2;
  undefined8 uVar3;
  dl_t paVar4;
  dl_el *pdVar5;
  uint uVar6;
  ulong uVar7;
  Branch *pBVar8;
  dl_el_s *pdVar9;
  dl_el_s *pdVar10;
  dl_el *pdVar11;
  int *piVar12;
  ulong uVar13;
  Tree TVar14;
  
  uVar7 = 0;
  pdVar5 = ht[d]->first;
  if (0 < d) {
    uVar7 = (ulong)(uint)d;
  }
  do {
    pdVar11 = pdVar5;
    if (pdVar11 == (dl_el *)0x0) {
      if (d < 10) {
        TVar14 = flutes_LD(d,xs,ys,s);
      }
      else {
        TVar14 = flutes_MD(d,xs,ys,s,acc);
      }
      pdVar9 = (dl_el_s *)malloc((long)(d * 2 + -2) * 0xc);
      for (uVar6 = d * 2 - 3; uVar7 = (ulong)uVar6, -1 < (int)uVar6; uVar6 = uVar6 - 1) {
        *(int *)((long)&pdVar9->next + uVar7 * 0xc) = TVar14.branch[uVar7].n;
        *(undefined8 *)((long)&pdVar9->prev + uVar7 * 0xc) = *(undefined8 *)(TVar14.branch + uVar7);
      }
      pdVar10 = (dl_el_s *)malloc(0x20);
      if (pdVar10 == (dl_el_s *)0x0) {
        puts("Out of memory!!");
      }
      else {
        pdVar10[1].prev = TVar14._0_8_;
        pdVar10[1].next = pdVar9;
        pdVar10->prev = (dl_el_s *)0x0;
        paVar4 = ht[d];
        if (paVar4->count == 0) {
          pdVar10->next = (dl_el_s *)0x0;
          paVar4->last = pdVar10;
          ht[d]->first = pdVar10;
          ht[d]->count = 1;
        }
        else {
          pdVar5 = paVar4->first;
          pdVar10->next = pdVar5;
          pdVar5->prev = pdVar10;
          ht[d]->first = pdVar10;
          ht[d]->count = ht[d]->count + 1;
        }
      }
      return TVar14;
    }
    pdVar9 = pdVar11[1].next;
    piVar12 = (int *)((long)&pdVar9->prev + 4);
    uVar13 = 0;
    do {
      if (uVar7 == uVar13) {
        pdVar10 = pdVar11[1].prev;
        pBVar8 = (Branch *)malloc((long)(d * 2 + -2) * 0xc);
        TVar14.branch = pBVar8;
        TVar14._0_8_ = pdVar10;
        for (uVar6 = d * 2 - 3; uVar7 = (ulong)uVar6, -1 < (int)uVar6; uVar6 = uVar6 - 1) {
          pBVar8[uVar7].n = *(int *)((long)&pdVar9->next + uVar7 * 0xc);
          uVar3 = *(undefined8 *)((long)&pdVar9->prev + uVar7 * 0xc);
          pBVar8[uVar7].x = (int)uVar3;
          pBVar8[uVar7].y = (int)((ulong)uVar3 >> 0x20);
        }
        return TVar14;
      }
      pdVar5 = pdVar11->next;
      if (*piVar12 != ys[uVar13]) break;
      piVar1 = piVar12 + -1;
      piVar2 = s + uVar13;
      uVar13 = uVar13 + 1;
      piVar12 = piVar12 + 3;
    } while (*piVar1 == xs[*piVar2]);
  } while( true );
}

Assistant:

Tree flutes_c(int d, DTYPE *xs, DTYPE *ys, int *s, int acc)
{
  int i;
  //int orig_ht_flag;
  Tree t, tdup;

#if USE_HASHING
  dl_forall(Tree, ht[d], t) {
    for (i=0; i<d; i++) {
      if (t.branch[i].y != ys[i] || t.branch[i].x != xs[s[i]]) {
	break;
      }
    }
    if (i >= d) { // found a match
      tdup = t;
      tdup.branch = (Branch*)malloc(sizeof(Branch)*(2*d-2));
      for (i=2*d-3; i>=0; i--) {
	tdup.branch[i] = t.branch[i];
      }
      return tdup;
    }
  } dl_endfor;

  //orig_ht_flag = new_ht;
  //new_ht = 0;
#endif

  t = flutes_LMD(d, xs, ys, s, acc);

#if USE_HASHING
  //new_ht = orig_ht_flag;
      
  tdup = t;
  tdup.branch = (Branch*)malloc(sizeof(Branch)*(2*d-2));
  for (i=2*d-3; i>=0; i--) {
    tdup.branch[i] = t.branch[i];
  }
  dl_prepend(Tree, ht[d], tdup);
#endif  

  return t;
}